

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::HasField(Reflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  bool bVar2;
  uint32 uVar3;
  LogMessage *other;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField",
               "Field is repeated; the method requires a singular field.");
  }
  if (field[0x43] == (FieldDescriptor)0x1) {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    bVar2 = internal::ExtensionSet::Has
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                       *(int *)(field + 0x44));
    return bVar2;
  }
  lVar1 = *(long *)(field + 0x58);
  if (lVar1 != 0) {
    if (*(int *)(lVar1 + 0x18) == 1) {
      if (*(char *)(**(long **)(lVar1 + 0x20) + 0x41) != '\0') goto LAB_002bb315;
      if (*(char *)(**(long **)(lVar1 + 0x20) + 0x41) == '\x01') {
        internal::LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                   ,0x761);
        other = internal::LogMessage::operator<<
                          (&local_70,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=(&local_31,other);
        internal::LogMessage::~LogMessage(&local_70);
      }
    }
    return *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                   (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >>
                                      4) * -0x55555554 + (this->schema_).oneof_case_offset_)) ==
           *(int *)(field + 0x44);
  }
LAB_002bb315:
  bVar2 = HasBit(this,message,field);
  return bVar2;
}

Assistant:

bool Reflection::HasField(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (schema_.InRealOneof(field)) {
      return HasOneofField(message, field);
    } else {
      return HasBit(message, field);
    }
  }
}